

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

NodeType __thiscall c4::yml::Tree::type(Tree *this,size_t node)

{
  NodeData *pNVar1;
  
  pNVar1 = _p(this,node);
  return (NodeType)(pNVar1->m_type).type;
}

Assistant:

const char* type_str(size_t node) const { return NodeType::type_str(_p(node)->m_type); }